

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O0

void __thiscall QUndoStack::redo(QUndoStack *this)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  QUndoStackPrivate *pQVar4;
  QMessageLogger *this_00;
  QMessageLogger *pQVar5;
  const_reference ppQVar6;
  QUndoCommand *pQVar7;
  char *in_RDI;
  long in_FS_OFFSET;
  QUndoCommand *cmd;
  int idx;
  QUndoStackPrivate *d;
  char *in_stack_ffffffffffffff98;
  QList<QUndoCommand_*> *in_stack_ffffffffffffffa0;
  char *pcVar8;
  QUndoStackPrivate *in_stack_ffffffffffffffd8;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar8 = in_RDI;
  pQVar4 = d_func((QUndoStack *)0xa82dea);
  this_00 = (QMessageLogger *)(long)pQVar4->index;
  pQVar5 = (QMessageLogger *)QList<QUndoCommand_*>::size(&pQVar4->command_list);
  if (this_00 != pQVar5) {
    bVar3 = QList<QUndoCommand_*>::isEmpty((QList<QUndoCommand_*> *)0xa82e31);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      iVar1 = pQVar4->index;
      ppQVar6 = QList<QUndoCommand_*>::at
                          (in_stack_ffffffffffffffa0,(qsizetype)in_stack_ffffffffffffff98);
      pQVar7 = *ppQVar6;
      bVar3 = QUndoCommand::isObsolete(pQVar7);
      if (!bVar3) {
        (*pQVar7->_vptr_QUndoCommand[3])();
      }
      bVar3 = QUndoCommand::isObsolete(pQVar7);
      if (bVar3) {
        pQVar7 = QList<QUndoCommand_*>::takeAt((QList<QUndoCommand_*> *)this_00,(qsizetype)in_RDI);
        if (pQVar7 != (QUndoCommand *)0x0) {
          (*pQVar7->_vptr_QUndoCommand[1])();
        }
        if (iVar1 < pQVar4->clean_index) {
          resetClean((QUndoStack *)this_00);
        }
      }
      else {
        QUndoStackPrivate::setIndex
                  (in_stack_ffffffffffffffd8,(int)((ulong)pcVar8 >> 0x20),
                   SUB81((ulong)pcVar8 >> 0x18,0));
      }
    }
    else {
      QMessageLogger::QMessageLogger
                (this_00,in_RDI,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                 in_stack_ffffffffffffff98);
      QMessageLogger::warning
                (&stack0xffffffffffffffd8,"QUndoStack::redo(): cannot redo in the middle of a macro"
                );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUndoStack::redo()
{
    Q_D(QUndoStack);
    if (d->index == d->command_list.size())
        return;

    if (Q_UNLIKELY(!d->macro_stack.isEmpty())) {
        qWarning("QUndoStack::redo(): cannot redo in the middle of a macro");
        return;
    }

    int idx = d->index;
    QUndoCommand *cmd = d->command_list.at(idx);

    if (!cmd->isObsolete())
        cmd->redo(); // A separate check is done b/c the undo command may set obsolete flag

    if (cmd->isObsolete()) {
        delete d->command_list.takeAt(idx);

        if (d->clean_index > idx)
            resetClean();
    } else {
        d->setIndex(d->index + 1, false);
    }
}